

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InitialLabelCase::iterate(InitialLabelCase *this)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  undefined4 uVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  undefined8 uVar7;
  MessageBuilder *pMVar8;
  Enum<int,_2UL> EVar9;
  MessageBuilder local_bb8;
  allocator<char> local_a31;
  string local_a30;
  string local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  GetNameFunc local_9d0;
  int local_9c8;
  GetNameFunc local_9c0;
  int local_9b8;
  string local_9b0;
  allocator<char> local_989;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  int local_904;
  undefined1 local_900 [4];
  deUint32 err_3;
  allocator<char> local_779;
  string local_778;
  allocator<char> local_751;
  string local_750;
  ScopedLogSection local_730;
  ScopedLogSection section_1;
  allocator<char> local_5a1;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  GetNameFunc local_540;
  int local_538;
  GetNameFunc local_530;
  int local_528;
  string local_520;
  allocator<char> local_4f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  int local_474;
  undefined1 local_470 [4];
  deUint32 err_2;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  ScopedLogSection local_2a0;
  ScopedLogSection section;
  TestLog *local_288;
  int local_280;
  string local_278;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  int local_1cc;
  GetNameFunc p_Stack_1c8;
  deUint32 err_1;
  int local_1c0;
  GetNameFunc local_1b8;
  int local_1b0;
  string local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  int local_fc;
  char local_f8 [4];
  deUint32 err;
  char buffer [64];
  GLsync sync;
  int local_a0;
  GLuint shader;
  int outlen;
  undefined1 local_78 [8];
  ResultCollector result;
  Functions *gl;
  InitialLabelCase *this_local;
  
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 &&
         (bVar1 = isKHRDebugSupported((this->super_TestCase).m_context), bVar1))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar5->_vptr_RenderContext[3])();
      result.m_message.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&outlen," // ERROR: ",(allocator<char> *)((long)&shader + 3));
      tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar6,(string *)&outlen);
      std::__cxx11::string::~string((string *)&outlen);
      std::allocator<char>::~allocator((allocator<char> *)((long)&shader + 3));
      local_a0 = -1;
      uVar7 = (**(code **)(result.m_message.field_2._8_8_ + 0x640))(0x9117,0);
      do {
        local_fc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_fc != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,"Got Error ",&local_181);
          EVar9 = glu::getErrorStr(local_fc);
          p_Stack_1c8 = EVar9.m_getName;
          local_1c0 = EVar9.m_value;
          local_1b8 = p_Stack_1c8;
          local_1b0 = local_1c0;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1a8,&local_1b8);
          std::operator+(&local_160,&local_180,&local_1a8);
          std::operator+(&local_140,&local_160,": ");
          std::operator+(&local_120,&local_140,"fenceSync");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator(&local_181);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      uVar4 = (**(code **)(result.m_message.field_2._8_8_ + 0x3f0))(0x8b30);
      do {
        local_1cc = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_1cc != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,"Got Error ",&local_251);
          EVar9 = glu::getErrorStr(local_1cc);
          section.m_log = (TestLog *)EVar9.m_getName;
          local_280 = EVar9.m_value;
          local_288 = section.m_log;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_278,&local_288);
          std::operator+(&local_230,&local_250,&local_278);
          std::operator+(&local_210,&local_230,": ");
          std::operator+(&local_1f0,&local_210,"createShader");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_250);
          std::allocator<char>::~allocator(&local_251);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"Shader",&local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e8,"Shader object",&local_2e9);
      tcu::ScopedLogSection::ScopedLogSection(&local_2a0,pTVar6,&local_2c0,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_470,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_470,(char (*) [23])"Querying initial value");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_470);
      local_f8[0] = 'X';
      local_a0 = -1;
      (**(code **)(result.m_message.field_2._8_8_ + 0x958))(0x82e1,uVar4,0x40,&local_a0,local_f8);
      do {
        local_474 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_474 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f8,"Got Error ",&local_4f9);
          EVar9 = glu::getErrorStr(local_474);
          local_540 = EVar9.m_getName;
          local_538 = EVar9.m_value;
          local_530 = local_540;
          local_528 = local_538;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_520,&local_530);
          std::operator+(&local_4d8,&local_4f8,&local_520);
          std::operator+(&local_4b8,&local_4d8,": ");
          std::operator+(&local_498,&local_4b8,"getObjectLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_498);
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_520);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::allocator<char>::~allocator(&local_4f9);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (local_a0 == 0) {
        if (local_f8[0] == '\0') {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&section_1,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message
                    );
          pMVar8 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&section_1,
                              (char (*) [36])"Got 0-sized null-terminated string.");
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_1);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5a0,"label was not null terminated",&local_5a1);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_5a0);
          std::__cxx11::string::~string((string *)&local_5a0);
          std::allocator<char>::~allocator(&local_5a1);
        }
      }
      else {
        de::toString<int>(&local_580,&local_a0);
        std::operator+(&local_560,"\'length\' was not zero, got ",&local_580);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_560);
        std::__cxx11::string::~string((string *)&local_560);
        std::__cxx11::string::~string((string *)&local_580);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_2a0);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"Sync",&local_751);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_778,"Sync object",&local_779);
      tcu::ScopedLogSection::ScopedLogSection(&local_730,pTVar6,&local_750,&local_778);
      std::__cxx11::string::~string((string *)&local_778);
      std::allocator<char>::~allocator(&local_779);
      std::__cxx11::string::~string((string *)&local_750);
      std::allocator<char>::~allocator(&local_751);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_900,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_900,(char (*) [23])"Querying initial value");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_900);
      local_f8[0] = 'X';
      local_a0 = -1;
      (**(code **)(result.m_message.field_2._8_8_ + 0x960))(uVar7,0x40,&local_a0,local_f8);
      do {
        local_904 = (**(code **)(result.m_message.field_2._8_8_ + 0x800))();
        if (local_904 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_988,"Got Error ",&local_989);
          EVar9 = glu::getErrorStr(local_904);
          local_9d0 = EVar9.m_getName;
          local_9c8 = EVar9.m_value;
          local_9c0 = local_9d0;
          local_9b8 = local_9c8;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_9b0,&local_9c0);
          std::operator+(&local_968,&local_988,&local_9b0);
          std::operator+(&local_948,&local_968,": ");
          std::operator+(&local_928,&local_948,"getObjectPtrLabel");
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_928);
          std::__cxx11::string::~string((string *)&local_928);
          std::__cxx11::string::~string((string *)&local_948);
          std::__cxx11::string::~string((string *)&local_968);
          std::__cxx11::string::~string((string *)&local_9b0);
          std::__cxx11::string::~string((string *)&local_988);
          std::allocator<char>::~allocator(&local_989);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      if (local_a0 == 0) {
        if (local_f8[0] == '\0') {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_bb8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_bb8,(char (*) [36])"Got 0-sized null-terminated string.");
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_bb8);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a30,"label was not null terminated",&local_a31);
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_a30);
          std::__cxx11::string::~string((string *)&local_a30);
          std::allocator<char>::~allocator(&local_a31);
        }
      }
      else {
        de::toString<int>(&local_a10,&local_a0);
        std::operator+(&local_9f0,"\'length\' was not zero, got ",&local_a10);
        tcu::ResultCollector::fail((ResultCollector *)local_78,&local_9f0);
        std::__cxx11::string::~string((string *)&local_9f0);
        std::__cxx11::string::~string((string *)&local_a10);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_730);
      (**(code **)(result.m_message.field_2._8_8_ + 0x470))(uVar4);
      (**(code **)(result.m_message.field_2._8_8_ + 0x478))(uVar7);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_78,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
      return STOP;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x758);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

InitialLabelCase::IterateResult InitialLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");
		m_testCtx.getLog() << TestLog::Message << "Querying initial value" << TestLog::EndMessage;

		buffer[0] = 'X';
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 0)
			result.fail("'length' was not zero, got " + de::toString(outlen));
		else if (buffer[0] != '\0')
			result.fail("label was not null terminated");
		else
			m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");
		m_testCtx.getLog() << TestLog::Message << "Querying initial value" << TestLog::EndMessage;

		buffer[0] = 'X';
		outlen = -1;
		gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 0)
			result.fail("'length' was not zero, got " + de::toString(outlen));
		else if (buffer[0] != '\0')
			result.fail("label was not null terminated");
		else
			m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}